

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

BIGNUM * unmask_priv_key(EVP_PKEY *pk,uchar *buf,int len,int num_masks)

{
  int iVar1;
  undefined8 uVar2;
  BIGNUM *b;
  BN_CTX *ctx_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  EVP_PKEY *in_RDI;
  BN_CTX *ctx;
  BIGNUM *mask;
  uchar *p;
  EC_GROUP *group;
  EC_KEY *key_ptr;
  BIGNUM *q;
  BIGNUM *pknum_masked;
  EC_GROUP *local_68;
  EC_KEY *local_60;
  long local_48;
  BIGNUM *local_30;
  BIGNUM *local_28;
  BIGNUM *local_8;
  
  local_30 = (BIGNUM *)0x0;
  if (in_RDI == (EVP_PKEY *)0x0) {
    local_60 = (EC_KEY *)0x0;
  }
  else {
    local_60 = (EC_KEY *)EVP_PKEY_get0(in_RDI);
  }
  if (local_60 == (EC_KEY *)0x0) {
    local_68 = (EC_GROUP *)0x0;
  }
  else {
    local_68 = EC_KEY_get0_group(local_60);
  }
  uVar2 = BN_secure_new();
  local_28 = (BIGNUM *)BN_lebin2bn(in_RSI,in_EDX,uVar2);
  if (local_28 == (BIGNUM *)0x0) {
    local_8 = (BIGNUM *)0x0;
  }
  else {
    if (0 < in_ECX) {
      local_48 = in_RSI + in_ECX * in_EDX;
      local_30 = BN_new();
      if (((local_30 == (BIGNUM *)0x0) || (local_68 == (EC_GROUP *)0x0)) ||
         (iVar1 = EC_GROUP_get_order(local_68,local_30,(BN_CTX *)0x0), iVar1 < 1)) {
        BN_free(local_28);
        local_28 = (BIGNUM *)0x0;
      }
      else {
        for (; local_48 != in_RSI; local_48 = local_48 - in_EDX) {
          uVar2 = BN_secure_new();
          b = (BIGNUM *)BN_lebin2bn(local_48,in_EDX,uVar2);
          ctx_00 = (BN_CTX *)BN_CTX_secure_new();
          BN_mod_mul(local_28,local_28,b,local_30,ctx_00);
          BN_CTX_free(ctx_00);
          BN_free(b);
        }
      }
    }
    if (local_30 != (BIGNUM *)0x0) {
      BN_free(local_30);
    }
    local_8 = local_28;
  }
  return (BIGNUM *)local_8;
}

Assistant:

static BIGNUM *unmask_priv_key(EVP_PKEY *pk,
                               const unsigned char *buf, int len, int num_masks)
{
    BIGNUM *pknum_masked = NULL, *q = NULL;
    const EC_KEY *key_ptr = (pk) ? EVP_PKEY_get0(pk) : NULL;
    const EC_GROUP *group = (key_ptr) ? EC_KEY_get0_group(key_ptr) : NULL;

    pknum_masked = BN_lebin2bn(buf, len, BN_secure_new());
    if (!pknum_masked)
        return NULL;

    if (num_masks > 0) {
        /*
         * XXX Remove sign by gost94
         */
        const unsigned char *p = buf + num_masks * len;

        q = BN_new();
        if (!q || !group || EC_GROUP_get_order(group, q, NULL) <= 0) {
            BN_free(pknum_masked);
            pknum_masked = NULL;
            goto end;
        }

        for (; p != buf; p -= len) {
            BIGNUM *mask = BN_lebin2bn(p, len, BN_secure_new());
            BN_CTX *ctx = BN_CTX_secure_new();

            BN_mod_mul(pknum_masked, pknum_masked, mask, q, ctx);

            BN_CTX_free(ctx);
            BN_free(mask);
        }
    }

 end:
    if (q)
        BN_free(q);
    return pknum_masked;
}